

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master_link.cpp
# Opt level: O0

void __thiscall miniros::MasterLink::invalidateParentParams(MasterLink *this,string *key)

{
  bool bVar1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  string *in_stack_00000048;
  string ns_key;
  iterator in_stack_ffffffffffffff78;
  undefined5 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff85;
  undefined1 in_stack_ffffffffffffff86;
  undefined1 in_stack_ffffffffffffff87;
  string local_70 [32];
  _Self local_50;
  _Self local_48 [3];
  string local_30 [48];
  
  if (*(long *)&(in_RDI->_M_t)._M_impl != 0) {
    names::parentNamespace(in_stack_00000048);
    while( true ) {
      in_stack_ffffffffffffff87 =
           std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_ffffffffffffff87,
                                    CONCAT16(in_stack_ffffffffffffff86,
                                             CONCAT15(in_stack_ffffffffffffff85,
                                                      in_stack_ffffffffffffff80))),
                           (char *)in_stack_ffffffffffffff78._M_node);
      in_stack_ffffffffffffff86 = false;
      if ((bool)in_stack_ffffffffffffff87) {
        in_stack_ffffffffffffff85 =
             std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_ffffffffffffff87,
                                      (uint7)CONCAT15(in_stack_ffffffffffffff85,
                                                      in_stack_ffffffffffffff80)),
                             (char *)in_stack_ffffffffffffff78._M_node);
        in_stack_ffffffffffffff86 = in_stack_ffffffffffffff85;
      }
      if ((bool)in_stack_ffffffffffffff86 == false) break;
      in_stack_ffffffffffffff78 =
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find(in_RDI,(key_type *)
                         CONCAT17(in_stack_ffffffffffffff87,
                                  CONCAT16(in_stack_ffffffffffffff86,
                                           CONCAT15(in_stack_ffffffffffffff85,
                                                    in_stack_ffffffffffffff80))));
      local_48[0]._M_node = in_stack_ffffffffffffff78._M_node;
      local_50._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(in_stack_ffffffffffffff78._M_node);
      bVar1 = std::operator!=(local_48,&local_50);
      if (bVar1) {
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>_>
        ::erase((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>_>
                 *)CONCAT17(in_stack_ffffffffffffff87,
                            CONCAT16(in_stack_ffffffffffffff86,
                                     CONCAT15(in_stack_ffffffffffffff85,in_stack_ffffffffffffff80)))
                ,(key_type *)in_stack_ffffffffffffff78._M_node);
      }
      names::parentNamespace(in_stack_00000048);
      std::__cxx11::string::operator=(local_30,local_70);
      std::__cxx11::string::~string(local_70);
    }
    std::__cxx11::string::~string(local_30);
  }
  return;
}

Assistant:

void MasterLink::invalidateParentParams(const std::string& key)
{
  if (!internal_)
    return;
  std::string ns_key = names::parentNamespace(key);
  while (ns_key != "" && ns_key != "/") {
    if (internal_->subscribed_params.find(ns_key) != internal_->subscribed_params.end()) {
      // by erasing the key the parameter will be re-queried
      internal_->params.erase(ns_key);
    }
    ns_key = names::parentNamespace(ns_key);
  }
}